

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

int __thiscall QWizardPage::nextId(QWizardPage *this)

{
  long lVar1;
  _Rb_tree_node_base *p_Var2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  
  lVar1 = *(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600);
  if (lVar1 != 0) {
    lVar1 = *(long *)(*(long *)(lVar1 + 8) + 0x2e0);
    if (lVar1 == 0) {
      p_Var2 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var2 = *(_Rb_tree_node_base **)(lVar1 + 0x20);
    }
    p_Var4 = (_Rb_tree_node_base *)(lVar1 + 0x10);
    if (lVar1 == 0) {
      p_Var4 = (_Rb_tree_node_base *)0x0;
    }
    if (p_Var2 != p_Var4) {
      bVar3 = false;
      do {
        if (p_Var2[1]._M_parent == (_Base_ptr)this) {
          bVar3 = true;
        }
        else if (bVar3) {
          return p_Var2[1]._M_color;
        }
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
      } while (p_Var2 != p_Var4);
    }
  }
  return -1;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }